

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O1

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::DuplicateRowsPS::execute
          (DuplicateRowsPS *this,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *param_1,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *y,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *s,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *param_4,
          DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
          *cStatus,DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   *rStatus,bool isOptimal)

{
  undefined8 *puVar1;
  int iVar2;
  pointer pnVar3;
  undefined8 uVar4;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar5;
  int32_t iVar6;
  int iVar7;
  cpp_dec_float<200U,_int,_void> *pcVar8;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar9;
  VarStatus VVar10;
  long lVar11;
  long lVar12;
  cpp_dec_float<200U,_int,_void> *pcVar13;
  uint *puVar14;
  uint *puVar15;
  undefined4 *puVar16;
  cpp_dec_float<200U,_int,_void> *pcVar17;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar18;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar19;
  uint *puVar20;
  cpp_dec_float<200U,_int,_void> *pcVar21;
  pointer pnVar22;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar23;
  bool bVar24;
  long lVar25;
  long lVar26;
  VarStatus *pVVar27;
  byte bVar28;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  cpp_dec_float<200U,_int,_void> local_148;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c0;
  undefined1 local_b8 [136];
  
  bVar28 = 0;
  if ((this->m_isLast == true) && (lVar12 = (long)(this->m_perm).thesize, 0 < lVar12)) {
    lVar25 = lVar12 + 1;
    lVar12 = lVar12 * 0x20 + -2;
    do {
      lVar26 = (long)(this->m_perm).data[lVar25 + -2];
      if (-1 < lVar26) {
        pnVar3 = (s->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar1 = (undefined8 *)((long)&(pnVar3->m_backend).data + lVar12 * 4);
        puVar14 = (uint *)(pnVar3 + lVar26);
        puVar15 = (uint *)(puVar1 + -0xf);
        for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
          *puVar15 = *puVar14;
          puVar14 = puVar14 + 1;
          puVar15 = puVar15 + 1;
        }
        *(int *)(puVar1 + -1) = pnVar3[lVar26].m_backend.exp;
        *(bool *)((long)puVar1 + -4) = pnVar3[lVar26].m_backend.neg;
        *puVar1 = *(undefined8 *)&pnVar3[lVar26].m_backend.fpclass;
        pnVar3 = (y->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar14 = (uint *)((long)&(pnVar3->m_backend).data + lVar12 * 4 + -0x78);
        puVar15 = (uint *)(pnVar3 + lVar26);
        puVar20 = puVar14;
        for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
          *puVar20 = *puVar15;
          puVar15 = puVar15 + 1;
          puVar20 = puVar20 + 1;
        }
        puVar14[0x1c] = pnVar3[lVar26].m_backend.exp;
        *(bool *)(puVar14 + 0x1d) = pnVar3[lVar26].m_backend.neg;
        iVar6 = pnVar3[lVar26].m_backend.prec_elem;
        puVar14[0x1e] = pnVar3[lVar26].m_backend.fpclass;
        puVar14[0x1f] = iVar6;
        rStatus->data[lVar25 + -2] = rStatus->data[lVar26];
      }
      lVar25 = lVar25 + -1;
      lVar12 = lVar12 + -0x20;
    } while (1 < lVar25);
  }
  if (0 < (this->m_scale).
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused) {
    lVar25 = 0;
    lVar12 = 0;
    do {
      pNVar19 = (this->m_scale).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .m_elem;
      if (*(int *)((long)(&pNVar19->val + 1) + lVar25) != this->m_i) {
        local_148.fpclass = cpp_dec_float_finite;
        local_148.prec_elem = 0x1c;
        local_148.data._M_elems[0] = 0;
        local_148.data._M_elems[1] = 0;
        local_148.data._M_elems[2] = 0;
        local_148.data._M_elems[3] = 0;
        local_148.data._M_elems[4] = 0;
        local_148.data._M_elems[5] = 0;
        local_148.data._M_elems[6] = 0;
        local_148.data._M_elems[7] = 0;
        local_148.data._M_elems[8] = 0;
        local_148.data._M_elems[9] = 0;
        local_148.data._M_elems[10] = 0;
        local_148.data._M_elems[0xb] = 0;
        local_148.data._M_elems[0xc] = 0;
        local_148.data._M_elems[0xd] = 0;
        local_148.data._M_elems[0xe] = 0;
        local_148.data._M_elems[0xf] = 0;
        local_148.data._M_elems[0x10] = 0;
        local_148.data._M_elems[0x11] = 0;
        local_148.data._M_elems[0x12] = 0;
        local_148.data._M_elems[0x13] = 0;
        local_148.data._M_elems[0x14] = 0;
        local_148.data._M_elems[0x15] = 0;
        local_148.data._M_elems[0x16] = 0;
        local_148.data._M_elems[0x17] = 0;
        local_148.data._M_elems[0x18] = 0;
        local_148.data._M_elems[0x19] = 0;
        local_148.data._M_elems._104_5_ = 0;
        local_148.data._M_elems[0x1b]._1_3_ = 0;
        local_148.exp = 0;
        local_148.neg = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&local_148,
                   &(s->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[this->m_i].m_backend,
                   (cpp_dec_float<200U,_int,_void> *)
                   ((long)(pNVar19->val).m_backend.data._M_elems + lVar25));
        iVar2 = *(int *)((long)(&((this->m_scale).
                                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 .m_elem)->val + 1) + lVar25);
        pnVar3 = (s->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pcVar8 = &local_148;
        pnVar22 = pnVar3 + iVar2;
        for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
          (pnVar22->m_backend).data._M_elems[0] = *(undefined4 *)pcVar8;
          pcVar8 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar8 + ((ulong)bVar28 * -2 + 1) * 4);
          pnVar22 = (pointer)((long)pnVar22 + ((ulong)bVar28 * -2 + 1) * 4);
        }
        pnVar3[iVar2].m_backend.exp = local_148.exp;
        pnVar3[iVar2].m_backend.neg = local_148.neg;
        pnVar3[iVar2].m_backend.fpclass = local_148.fpclass;
        pnVar3[iVar2].m_backend.prec_elem = local_148.prec_elem;
      }
      lVar12 = lVar12 + 1;
      lVar25 = lVar25 + 0x84;
    } while (lVar12 < (this->m_scale).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .memused);
  }
  if (0 < (this->m_scale).
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused) {
    local_c0 = &this->m_i_rowObj;
    lVar25 = 0;
    lVar12 = 0;
    bVar24 = false;
    local_b8._128_8_ = y;
    do {
      pNVar19 = (this->m_scale).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .m_elem;
      iVar2 = *(int *)((long)(&pNVar19->val + 1) + lVar25);
      iVar7 = this->m_i;
      VVar10 = rStatus->data[iVar7];
      if ((VVar10 == BASIC) || ((bVar24 && (iVar2 != iVar7)))) {
LAB_0058b8d1:
        pNVar19 = (this->m_rowObj).
                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .m_elem;
        pnVar3 = (y->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar16 = (undefined4 *)((long)(pNVar19->val).m_backend.data._M_elems + lVar25);
        pnVar22 = pnVar3 + iVar2;
        for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
          (pnVar22->m_backend).data._M_elems[0] = *puVar16;
          puVar16 = puVar16 + (ulong)bVar28 * -2 + 1;
          pnVar22 = (pointer)((long)pnVar22 + ((ulong)bVar28 * -2 + 1) * 4);
        }
        pnVar3[iVar2].m_backend.exp = *(int *)((long)(&(pNVar19->val).m_backend.data + 1) + lVar25);
        pnVar3[iVar2].m_backend.neg =
             *(bool *)((long)(&(pNVar19->val).m_backend.data + 1) + lVar25 + 4);
        uVar4 = *(undefined8 *)((long)(&(pNVar19->val).m_backend.data + 1) + lVar25 + 8);
        pnVar3[iVar2].m_backend.fpclass = (int)uVar4;
        pnVar3[iVar2].m_backend.prec_elem = (int)((ulong)uVar4 >> 0x20);
        pVVar27 = rStatus->data + iVar2;
LAB_0058b917:
        *pVVar27 = BASIC;
      }
      else if ((VVar10 == FIXED) && ((iVar2 == this->m_maxLhsIdx || (iVar2 == this->m_minRhsIdx))))
      {
        pcVar13 = &(y->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar7].m_backend;
        pcVar17 = (cpp_dec_float<200U,_int,_void> *)
                  ((long)(pNVar19->val).m_backend.data._M_elems + lVar25);
        local_148.fpclass = cpp_dec_float_finite;
        local_148.prec_elem = 0x1c;
        local_148.data._M_elems[0] = 0;
        local_148.data._M_elems[1] = 0;
        local_148.data._M_elems[2] = 0;
        local_148.data._M_elems[3] = 0;
        local_148.data._M_elems[4] = 0;
        local_148.data._M_elems[5] = 0;
        local_148.data._M_elems[6] = 0;
        local_148.data._M_elems[7] = 0;
        local_148.data._M_elems[8] = 0;
        local_148.data._M_elems[9] = 0;
        local_148.data._M_elems[10] = 0;
        local_148.data._M_elems[0xb] = 0;
        local_148.data._M_elems[0xc] = 0;
        local_148.data._M_elems[0xd] = 0;
        local_148.data._M_elems[0xe] = 0;
        local_148.data._M_elems[0xf] = 0;
        local_148.data._M_elems[0x10] = 0;
        local_148.data._M_elems[0x11] = 0;
        local_148.data._M_elems[0x12] = 0;
        local_148.data._M_elems[0x13] = 0;
        local_148.data._M_elems[0x14] = 0;
        local_148.data._M_elems[0x15] = 0;
        local_148.data._M_elems[0x16] = 0;
        local_148.data._M_elems[0x17] = 0;
        local_148.data._M_elems[0x18] = 0;
        local_148.data._M_elems[0x19] = 0;
        local_148.data._M_elems._104_5_ = 0;
        local_148.data._M_elems[0x1b]._1_3_ = 0;
        local_148.exp = 0;
        local_148.neg = false;
        pcVar8 = pcVar13;
        if ((pcVar17 != &local_148) && (pcVar8 = pcVar17, &local_148 != pcVar13)) {
          pcVar17 = pcVar13;
          pcVar21 = &local_148;
          for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
            *(uint *)pcVar21 = (pcVar17->data)._M_elems[0];
            pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar28 * -8 + 4);
            pcVar21 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar21 + ((ulong)bVar28 * -2 + 1) * 4);
          }
          local_148.exp = pcVar13->exp;
          local_148.neg = pcVar13->neg;
          local_148.fpclass = pcVar13->fpclass;
          local_148.prec_elem = pcVar13->prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  (&local_148,pcVar8);
        pnVar3 = (y->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pcVar8 = &local_148;
        pnVar22 = pnVar3 + iVar2;
        for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
          (pnVar22->m_backend).data._M_elems[0] = *(undefined4 *)pcVar8;
          pcVar8 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar8 + ((ulong)bVar28 * -2 + 1) * 4);
          pnVar22 = (pointer)((long)pnVar22 + ((ulong)bVar28 * -2 + 1) * 4);
        }
        pnVar3[iVar2].m_backend.exp = local_148.exp;
        pnVar3[iVar2].m_backend.neg = local_148.neg;
        pnVar3[iVar2].m_backend.fpclass = local_148.fpclass;
        pnVar3[iVar2].m_backend.prec_elem = local_148.prec_elem;
        iVar7 = this->m_i;
        pnVar3 = (y->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pnVar18 = local_c0;
        pnVar22 = pnVar3 + iVar7;
        for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
          (pnVar22->m_backend).data._M_elems[0] = (pnVar18->m_backend).data._M_elems[0];
          pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar18 + (ulong)bVar28 * -8 + 4);
          pnVar22 = (pointer)((long)pnVar22 + ((ulong)bVar28 * -2 + 1) * 4);
        }
        pnVar3[iVar7].m_backend.exp = (this->m_i_rowObj).m_backend.exp;
        pnVar3[iVar7].m_backend.neg = (this->m_i_rowObj).m_backend.neg;
        iVar6 = (this->m_i_rowObj).m_backend.prec_elem;
        pnVar3[iVar7].m_backend.fpclass = (this->m_i_rowObj).m_backend.fpclass;
        pnVar3[iVar7].m_backend.prec_elem = iVar6;
        if ((this->m_isLhsEqualRhs).data[lVar12] == true) {
          rStatus->data[iVar2] = FIXED;
        }
        else {
          if (iVar2 == this->m_maxLhsIdx) {
            pNVar5 = (this->m_scale).
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .m_elem;
            pNVar19 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)((long)(pNVar5->val).m_backend.data._M_elems + lVar25);
            local_b8._120_4_ = cpp_dec_float_finite;
            local_b8._124_4_ = 0x1c;
            local_b8._0_4_ = 0;
            local_b8._4_4_ = 0;
            local_b8._8_4_ = 0;
            local_b8._12_4_ = 0;
            local_b8._16_4_ = 0;
            local_b8._20_4_ = 0;
            local_b8._24_4_ = 0;
            local_b8._28_4_ = 0;
            local_b8._32_4_ = 0;
            local_b8._36_4_ = 0;
            local_b8._40_4_ = 0;
            local_b8._44_4_ = 0;
            local_b8._48_4_ = 0;
            local_b8._52_4_ = 0;
            local_b8._56_4_ = 0;
            local_b8._60_4_ = 0;
            local_b8._64_4_ = 0;
            local_b8._68_4_ = 0;
            local_b8._72_4_ = 0;
            local_b8._76_4_ = 0;
            local_b8._80_4_ = 0;
            local_b8._84_4_ = 0;
            local_b8._88_4_ = 0;
            local_b8._92_4_ = 0;
            local_b8._96_4_ = 0;
            local_b8._100_4_ = 0;
            local_b8._104_5_ = 0;
            local_b8._109_3_ = 0;
            local_b8._112_4_ = 0;
            local_b8[0x74] = false;
            pNVar9 = pNVar19;
            if (((Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)local_b8 != pNVar5) &&
               (pNVar9 = pNVar5,
               pNVar19 !=
               (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)local_b8)) {
              pNVar23 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)local_b8;
              for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
                (pNVar23->val).m_backend.data._M_elems[0] =
                     (pNVar19->val).m_backend.data._M_elems[0];
                pNVar19 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)((long)pNVar19 + (ulong)bVar28 * -8 + 4);
                pNVar23 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)((long)pNVar23 + (ulong)bVar28 * -8 + 4);
              }
              local_b8._112_4_ = *(int *)((long)(&(pNVar5->val).m_backend.data + 1) + lVar25);
              local_b8[0x74] =
                   *(undefined1 *)((long)(&(pNVar5->val).m_backend.data + 1) + lVar25 + 4);
              local_b8._120_8_ =
                   *(undefined8 *)((long)(&(pNVar5->val).m_backend.data + 1) + lVar25 + 8);
            }
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                      ((cpp_dec_float<200U,_int,_void> *)local_b8,
                       (cpp_dec_float<200U,_int,_void> *)pNVar9);
            VVar10 = ON_UPPER;
            if (local_b8._120_4_ != cpp_dec_float_NaN) {
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>(&local_148,0,(type *)0x0);
              iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                ((cpp_dec_float<200U,_int,_void> *)local_b8,&local_148);
              VVar10 = (VarStatus)(0 < iVar7);
            }
          }
          else {
            pNVar5 = (this->m_scale).
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .m_elem;
            pNVar19 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)((long)(pNVar5->val).m_backend.data._M_elems + lVar25);
            local_b8._120_4_ = cpp_dec_float_finite;
            local_b8._124_4_ = 0x1c;
            local_b8._0_4_ = 0;
            local_b8._4_4_ = 0;
            local_b8._8_4_ = 0;
            local_b8._12_4_ = 0;
            local_b8._16_4_ = 0;
            local_b8._20_4_ = 0;
            local_b8._24_4_ = 0;
            local_b8._28_4_ = 0;
            local_b8._32_4_ = 0;
            local_b8._36_4_ = 0;
            local_b8._40_4_ = 0;
            local_b8._44_4_ = 0;
            local_b8._48_4_ = 0;
            local_b8._52_4_ = 0;
            local_b8._56_4_ = 0;
            local_b8._60_4_ = 0;
            local_b8._64_4_ = 0;
            local_b8._68_4_ = 0;
            local_b8._72_4_ = 0;
            local_b8._76_4_ = 0;
            local_b8._80_4_ = 0;
            local_b8._84_4_ = 0;
            local_b8._88_4_ = 0;
            local_b8._92_4_ = 0;
            local_b8._96_4_ = 0;
            local_b8._100_4_ = 0;
            local_b8._104_5_ = 0;
            local_b8._109_3_ = 0;
            local_b8._112_4_ = 0;
            local_b8[0x74] = false;
            pNVar9 = pNVar19;
            if (((Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)local_b8 != pNVar5) &&
               (pNVar9 = pNVar5,
               pNVar19 !=
               (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)local_b8)) {
              pNVar23 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)local_b8;
              for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
                (pNVar23->val).m_backend.data._M_elems[0] =
                     (pNVar19->val).m_backend.data._M_elems[0];
                pNVar19 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)((long)pNVar19 + (ulong)bVar28 * -8 + 4);
                pNVar23 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)((long)pNVar23 + (ulong)bVar28 * -8 + 4);
              }
              local_b8._112_4_ = *(int *)((long)(&(pNVar5->val).m_backend.data + 1) + lVar25);
              local_b8[0x74] =
                   *(undefined1 *)((long)(&(pNVar5->val).m_backend.data + 1) + lVar25 + 4);
              local_b8._120_8_ =
                   *(undefined8 *)((long)(&(pNVar5->val).m_backend.data + 1) + lVar25 + 8);
            }
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                      ((cpp_dec_float<200U,_int,_void> *)local_b8,
                       (cpp_dec_float<200U,_int,_void> *)pNVar9);
            VVar10 = ON_LOWER;
            if (local_b8._120_4_ != cpp_dec_float_NaN) {
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>(&local_148,0,(type *)0x0);
              iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                ((cpp_dec_float<200U,_int,_void> *)local_b8,&local_148);
              VVar10 = (VarStatus)(iVar7 < 1);
            }
          }
          rStatus->data[iVar2] = VVar10;
        }
        bVar24 = true;
        if (iVar2 != this->m_i) {
          pVVar27 = rStatus->data + this->m_i;
          bVar24 = true;
          goto LAB_0058b917;
        }
      }
      else {
        if ((VVar10 == ON_LOWER) && (iVar2 == this->m_maxLhsIdx)) {
          pcVar13 = &(y->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar7].m_backend;
          pcVar17 = (cpp_dec_float<200U,_int,_void> *)
                    ((long)(pNVar19->val).m_backend.data._M_elems + lVar25);
          local_148.fpclass = cpp_dec_float_finite;
          local_148.prec_elem = 0x1c;
          local_148.data._M_elems[0] = 0;
          local_148.data._M_elems[1] = 0;
          local_148.data._M_elems[2] = 0;
          local_148.data._M_elems[3] = 0;
          local_148.data._M_elems[4] = 0;
          local_148.data._M_elems[5] = 0;
          local_148.data._M_elems[6] = 0;
          local_148.data._M_elems[7] = 0;
          local_148.data._M_elems[8] = 0;
          local_148.data._M_elems[9] = 0;
          local_148.data._M_elems[10] = 0;
          local_148.data._M_elems[0xb] = 0;
          local_148.data._M_elems[0xc] = 0;
          local_148.data._M_elems[0xd] = 0;
          local_148.data._M_elems[0xe] = 0;
          local_148.data._M_elems[0xf] = 0;
          local_148.data._M_elems[0x10] = 0;
          local_148.data._M_elems[0x11] = 0;
          local_148.data._M_elems[0x12] = 0;
          local_148.data._M_elems[0x13] = 0;
          local_148.data._M_elems[0x14] = 0;
          local_148.data._M_elems[0x15] = 0;
          local_148.data._M_elems[0x16] = 0;
          local_148.data._M_elems[0x17] = 0;
          local_148.data._M_elems[0x18] = 0;
          local_148.data._M_elems[0x19] = 0;
          local_148.data._M_elems._104_5_ = 0;
          local_148.data._M_elems[0x1b]._1_3_ = 0;
          local_148.exp = 0;
          local_148.neg = false;
          pcVar8 = pcVar13;
          if ((pcVar17 != &local_148) && (pcVar8 = pcVar17, &local_148 != pcVar13)) {
            pcVar17 = pcVar13;
            pcVar21 = &local_148;
            for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
              *(uint *)pcVar21 = (pcVar17->data)._M_elems[0];
              pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar28 * -8 + 4);
              pcVar21 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)pcVar21 + ((ulong)bVar28 * -2 + 1) * 4);
            }
            local_148.exp = pcVar13->exp;
            local_148.neg = pcVar13->neg;
            local_148.fpclass = pcVar13->fpclass;
            local_148.prec_elem = pcVar13->prec_elem;
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    (&local_148,pcVar8);
          pnVar3 = (y->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pcVar8 = &local_148;
          pnVar22 = pnVar3 + iVar2;
          for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
            (pnVar22->m_backend).data._M_elems[0] = *(undefined4 *)pcVar8;
            pcVar8 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar8 + ((ulong)bVar28 * -2 + 1) * 4)
            ;
            pnVar22 = (pointer)((long)pnVar22 + ((ulong)bVar28 * -2 + 1) * 4);
          }
          pnVar3[iVar2].m_backend.exp = local_148.exp;
          pnVar3[iVar2].m_backend.neg = local_148.neg;
          pnVar3[iVar2].m_backend.fpclass = local_148.fpclass;
          pnVar3[iVar2].m_backend.prec_elem = local_148.prec_elem;
          iVar7 = this->m_i;
          pnVar3 = (y->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pnVar18 = local_c0;
          pnVar22 = pnVar3 + iVar7;
          for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
            (pnVar22->m_backend).data._M_elems[0] = (pnVar18->m_backend).data._M_elems[0];
            pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar18 + (ulong)bVar28 * -8 + 4);
            pnVar22 = (pointer)((long)pnVar22 + ((ulong)bVar28 * -2 + 1) * 4);
          }
          pnVar3[iVar7].m_backend.exp = (this->m_i_rowObj).m_backend.exp;
          pnVar3[iVar7].m_backend.neg = (this->m_i_rowObj).m_backend.neg;
          iVar6 = (this->m_i_rowObj).m_backend.prec_elem;
          pnVar3[iVar7].m_backend.fpclass = (this->m_i_rowObj).m_backend.fpclass;
          pnVar3[iVar7].m_backend.prec_elem = iVar6;
          pNVar5 = (this->m_scale).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .m_elem;
          pNVar19 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)((long)(pNVar5->val).m_backend.data._M_elems + lVar25);
          local_b8._120_4_ = cpp_dec_float_finite;
          local_b8._124_4_ = 0x1c;
          local_b8._0_4_ = 0;
          local_b8._4_4_ = 0;
          local_b8._8_4_ = 0;
          local_b8._12_4_ = 0;
          local_b8._16_4_ = 0;
          local_b8._20_4_ = 0;
          local_b8._24_4_ = 0;
          local_b8._28_4_ = 0;
          local_b8._32_4_ = 0;
          local_b8._36_4_ = 0;
          local_b8._40_4_ = 0;
          local_b8._44_4_ = 0;
          local_b8._48_4_ = 0;
          local_b8._52_4_ = 0;
          local_b8._56_4_ = 0;
          local_b8._60_4_ = 0;
          local_b8._64_4_ = 0;
          local_b8._68_4_ = 0;
          local_b8._72_4_ = 0;
          local_b8._76_4_ = 0;
          local_b8._80_4_ = 0;
          local_b8._84_4_ = 0;
          local_b8._88_4_ = 0;
          local_b8._92_4_ = 0;
          local_b8._96_4_ = 0;
          local_b8._100_4_ = 0;
          local_b8._104_5_ = 0;
          local_b8._109_3_ = 0;
          local_b8._112_4_ = 0;
          local_b8[0x74] = false;
          pNVar9 = pNVar19;
          if (((Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)local_b8 != pNVar5) &&
             (pNVar9 = pNVar5,
             pNVar19 !=
             (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)local_b8)) {
            pNVar23 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)local_b8;
            for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
              (pNVar23->val).m_backend.data._M_elems[0] = (pNVar19->val).m_backend.data._M_elems[0];
              pNVar19 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)((long)pNVar19 + (ulong)bVar28 * -8 + 4);
              pNVar23 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)((long)pNVar23 + (ulong)bVar28 * -8 + 4);
            }
            local_b8._112_4_ = *(int *)((long)(&(pNVar5->val).m_backend.data + 1) + lVar25);
            local_b8[0x74] = *(undefined1 *)((long)(&(pNVar5->val).m_backend.data + 1) + lVar25 + 4)
            ;
            local_b8._120_8_ =
                 *(undefined8 *)((long)(&(pNVar5->val).m_backend.data + 1) + lVar25 + 8);
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    ((cpp_dec_float<200U,_int,_void> *)local_b8,
                     (cpp_dec_float<200U,_int,_void> *)pNVar9);
          VVar10 = ON_UPPER;
          if (local_b8._120_4_ != cpp_dec_float_NaN) {
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
            cpp_dec_float<long_long>(&local_148,0,(type *)0x0);
            y = (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)local_b8._128_8_;
            iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)local_b8,&local_148);
            VVar10 = (VarStatus)(0 < iVar7);
          }
        }
        else {
          if ((VVar10 != ON_UPPER) || (iVar2 != this->m_minRhsIdx)) {
            if (iVar2 != iVar7) goto LAB_0058b8d1;
            goto LAB_0058b91f;
          }
          pcVar13 = &(y->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar7].m_backend;
          pcVar17 = (cpp_dec_float<200U,_int,_void> *)
                    ((long)(pNVar19->val).m_backend.data._M_elems + lVar25);
          local_148.fpclass = cpp_dec_float_finite;
          local_148.prec_elem = 0x1c;
          local_148.data._M_elems[0] = 0;
          local_148.data._M_elems[1] = 0;
          local_148.data._M_elems[2] = 0;
          local_148.data._M_elems[3] = 0;
          local_148.data._M_elems[4] = 0;
          local_148.data._M_elems[5] = 0;
          local_148.data._M_elems[6] = 0;
          local_148.data._M_elems[7] = 0;
          local_148.data._M_elems[8] = 0;
          local_148.data._M_elems[9] = 0;
          local_148.data._M_elems[10] = 0;
          local_148.data._M_elems[0xb] = 0;
          local_148.data._M_elems[0xc] = 0;
          local_148.data._M_elems[0xd] = 0;
          local_148.data._M_elems[0xe] = 0;
          local_148.data._M_elems[0xf] = 0;
          local_148.data._M_elems[0x10] = 0;
          local_148.data._M_elems[0x11] = 0;
          local_148.data._M_elems[0x12] = 0;
          local_148.data._M_elems[0x13] = 0;
          local_148.data._M_elems[0x14] = 0;
          local_148.data._M_elems[0x15] = 0;
          local_148.data._M_elems[0x16] = 0;
          local_148.data._M_elems[0x17] = 0;
          local_148.data._M_elems[0x18] = 0;
          local_148.data._M_elems[0x19] = 0;
          local_148.data._M_elems._104_5_ = 0;
          local_148.data._M_elems[0x1b]._1_3_ = 0;
          local_148.exp = 0;
          local_148.neg = false;
          pcVar8 = pcVar13;
          if ((pcVar17 != &local_148) && (pcVar8 = pcVar17, &local_148 != pcVar13)) {
            pcVar17 = pcVar13;
            pcVar21 = &local_148;
            for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
              *(uint *)pcVar21 = (pcVar17->data)._M_elems[0];
              pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar28 * -8 + 4);
              pcVar21 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)pcVar21 + ((ulong)bVar28 * -2 + 1) * 4);
            }
            local_148.exp = pcVar13->exp;
            local_148.neg = pcVar13->neg;
            local_148.fpclass = pcVar13->fpclass;
            local_148.prec_elem = pcVar13->prec_elem;
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    (&local_148,pcVar8);
          pnVar3 = (y->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pcVar8 = &local_148;
          pnVar22 = pnVar3 + iVar2;
          for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
            (pnVar22->m_backend).data._M_elems[0] = *(undefined4 *)pcVar8;
            pcVar8 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar8 + ((ulong)bVar28 * -2 + 1) * 4)
            ;
            pnVar22 = (pointer)((long)pnVar22 + ((ulong)bVar28 * -2 + 1) * 4);
          }
          pnVar3[iVar2].m_backend.exp = local_148.exp;
          pnVar3[iVar2].m_backend.neg = local_148.neg;
          pnVar3[iVar2].m_backend.fpclass = local_148.fpclass;
          pnVar3[iVar2].m_backend.prec_elem = local_148.prec_elem;
          iVar7 = this->m_i;
          pnVar3 = (y->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pnVar18 = local_c0;
          pnVar22 = pnVar3 + iVar7;
          for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
            (pnVar22->m_backend).data._M_elems[0] = (pnVar18->m_backend).data._M_elems[0];
            pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar18 + (ulong)bVar28 * -8 + 4);
            pnVar22 = (pointer)((long)pnVar22 + ((ulong)bVar28 * -2 + 1) * 4);
          }
          pnVar3[iVar7].m_backend.exp = (this->m_i_rowObj).m_backend.exp;
          pnVar3[iVar7].m_backend.neg = (this->m_i_rowObj).m_backend.neg;
          iVar6 = (this->m_i_rowObj).m_backend.prec_elem;
          pnVar3[iVar7].m_backend.fpclass = (this->m_i_rowObj).m_backend.fpclass;
          pnVar3[iVar7].m_backend.prec_elem = iVar6;
          pNVar5 = (this->m_scale).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .m_elem;
          pNVar19 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)((long)(pNVar5->val).m_backend.data._M_elems + lVar25);
          local_b8._120_4_ = cpp_dec_float_finite;
          local_b8._124_4_ = 0x1c;
          local_b8._0_4_ = 0;
          local_b8._4_4_ = 0;
          local_b8._8_4_ = 0;
          local_b8._12_4_ = 0;
          local_b8._16_4_ = 0;
          local_b8._20_4_ = 0;
          local_b8._24_4_ = 0;
          local_b8._28_4_ = 0;
          local_b8._32_4_ = 0;
          local_b8._36_4_ = 0;
          local_b8._40_4_ = 0;
          local_b8._44_4_ = 0;
          local_b8._48_4_ = 0;
          local_b8._52_4_ = 0;
          local_b8._56_4_ = 0;
          local_b8._60_4_ = 0;
          local_b8._64_4_ = 0;
          local_b8._68_4_ = 0;
          local_b8._72_4_ = 0;
          local_b8._76_4_ = 0;
          local_b8._80_4_ = 0;
          local_b8._84_4_ = 0;
          local_b8._88_4_ = 0;
          local_b8._92_4_ = 0;
          local_b8._96_4_ = 0;
          local_b8._100_4_ = 0;
          local_b8._104_5_ = 0;
          local_b8._109_3_ = 0;
          local_b8._112_4_ = 0;
          local_b8[0x74] = false;
          pNVar9 = pNVar19;
          if (((Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)local_b8 != pNVar5) &&
             (pNVar9 = pNVar5,
             pNVar19 !=
             (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)local_b8)) {
            pNVar23 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)local_b8;
            for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
              (pNVar23->val).m_backend.data._M_elems[0] = (pNVar19->val).m_backend.data._M_elems[0];
              pNVar19 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)((long)pNVar19 + (ulong)bVar28 * -8 + 4);
              pNVar23 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)((long)pNVar23 + (ulong)bVar28 * -8 + 4);
            }
            local_b8._112_4_ = *(int *)((long)(&(pNVar5->val).m_backend.data + 1) + lVar25);
            local_b8[0x74] = *(undefined1 *)((long)(&(pNVar5->val).m_backend.data + 1) + lVar25 + 4)
            ;
            local_b8._120_8_ =
                 *(undefined8 *)((long)(&(pNVar5->val).m_backend.data + 1) + lVar25 + 8);
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    ((cpp_dec_float<200U,_int,_void> *)local_b8,
                     (cpp_dec_float<200U,_int,_void> *)pNVar9);
          VVar10 = ON_LOWER;
          if (local_b8._120_4_ != cpp_dec_float_NaN) {
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
            cpp_dec_float<long_long>(&local_148,0,(type *)0x0);
            y = (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)local_b8._128_8_;
            iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)local_b8,&local_148);
            VVar10 = (VarStatus)(iVar7 < 1);
          }
        }
        pVVar27 = rStatus->data;
        pVVar27[iVar2] = VVar10;
        bVar24 = true;
        if (iVar2 != this->m_i) {
          pVVar27 = pVVar27 + this->m_i;
          bVar24 = true;
          goto LAB_0058b917;
        }
      }
LAB_0058b91f:
      lVar12 = lVar12 + 1;
      lVar25 = lVar25 + 0x84;
    } while (lVar12 < (this->m_scale).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .memused);
  }
  return;
}

Assistant:

void SPxMainSM<R>::DuplicateRowsPS::execute(VectorBase<R>&, VectorBase<R>& y, VectorBase<R>& s,
      VectorBase<R>&,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // correcting the change of idx by deletion of the duplicated rows:
   if(m_isLast)
   {
      for(int i = m_perm.size() - 1; i >= 0; --i)
      {
         if(m_perm[i] >= 0)
         {
            int rIdx_new = m_perm[i];
            int rIdx = i;
            s[rIdx] = s[rIdx_new];
            y[rIdx] = y[rIdx_new];
            rStatus[rIdx] = rStatus[rIdx_new];
         }
      }
   }

   // primal:
   for(int k = 0; k < m_scale.size(); ++k)
   {
      if(m_scale.index(k) != m_i)
         s[m_scale.index(k)] = s[m_i] / m_scale.value(k);
   }

   // dual & basis:
   bool haveSetBasis = false;

   for(int k = 0; k < m_scale.size(); ++k)
   {
      int i = m_scale.index(k);

      if(rStatus[m_i] == SPxSolverBase<R>::BASIC || (haveSetBasis && i != m_i))
         // if the row with tightest lower and upper bound in the basic, every duplicate row should in basic
         // or basis status of row m_i has been set, this row should be in basis
      {
         y[i]       = m_rowObj.value(k);
         rStatus[i] = SPxSolverBase<R>::BASIC;
         continue;
      }

      SOPLEX_ASSERT_WARN("WMAISM02", isNotZero(m_scale.value(k), this->epsilon()));

      if(rStatus[m_i] == SPxSolverBase<R>::FIXED && (i == m_maxLhsIdx || i == m_minRhsIdx))
      {
         // this row leads to the tightest lower or upper bound, slack should not be in the basis
         y[i]   = y[m_i] * m_scale.value(k);
         y[m_i] = m_i_rowObj;

         if(m_isLhsEqualRhs[k])
         {
            rStatus[i] = SPxSolverBase<R>::FIXED;
         }
         else if(i == m_maxLhsIdx)
         {
            rStatus[i] = m_scale.value(k) * m_scale.value(0) > 0 ? SPxSolverBase<R>::ON_LOWER :
                         SPxSolverBase<R>::ON_UPPER;
         }
         else
         {
            assert(i == m_minRhsIdx);

            rStatus[i] = m_scale.value(k) * m_scale.value(0) > 0 ? SPxSolverBase<R>::ON_UPPER :
                         SPxSolverBase<R>::ON_LOWER;
         }

         if(i != m_i)
            rStatus[m_i] = SPxSolverBase<R>::BASIC;

         haveSetBasis = true;
      }
      else if(i == m_maxLhsIdx && rStatus[m_i] == SPxSolverBase<R>::ON_LOWER)
      {
         // this row leads to the tightest lower bound, slack should not be in the basis
         y[i]   = y[m_i] * m_scale.value(k);
         y[m_i] = m_i_rowObj;

         rStatus[i] = m_scale.value(k) * m_scale.value(0) > 0 ? SPxSolverBase<R>::ON_LOWER :
                      SPxSolverBase<R>::ON_UPPER;

         if(i != m_i)
            rStatus[m_i] = SPxSolverBase<R>::BASIC;

         haveSetBasis = true;
      }
      else if(i == m_minRhsIdx && rStatus[m_i] == SPxSolverBase<R>::ON_UPPER)
      {
         // this row leads to the tightest upper bound, slack should not be in the basis
         y[i]   = y[m_i] * m_scale.value(k);
         y[m_i] = m_i_rowObj;

         rStatus[i] = m_scale.value(k) * m_scale.value(0) > 0 ? SPxSolverBase<R>::ON_UPPER :
                      SPxSolverBase<R>::ON_LOWER;

         if(i != m_i)
            rStatus[m_i] = SPxSolverBase<R>::BASIC;

         haveSetBasis = true;
      }
      else if(i != m_i)
      {
         // this row does not lead to the tightest lower or upper bound, slack should be in the basis
         y[i]       = m_rowObj.value(k);
         rStatus[i] = SPxSolverBase<R>::BASIC;
      }
   }

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(m_isFirst && !this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM24 Dimension doesn't match after this step.");
   }

#endif

   // nothing to do for the reduced cost values
}